

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

void agc_emax(agc_t *agc,mfcc_t **mfc,int32 n_frame)

{
  float fVar1;
  float *pfVar2;
  ulong uVar3;
  
  if (0 < n_frame) {
    uVar3 = 0;
    do {
      pfVar2 = (float *)mfc[uVar3];
      fVar1 = *pfVar2;
      if ((float)agc->obs_max <= fVar1 && fVar1 != (float)agc->obs_max) {
        agc->obs_max = (mfcc_t)fVar1;
        agc->obs_frame = 1;
      }
      *pfVar2 = *pfVar2 - (float)agc->max;
      uVar3 = uVar3 + 1;
    } while ((uint)n_frame != uVar3);
  }
  return;
}

Assistant:

void
agc_emax(agc_t *agc, mfcc_t **mfc, int32 n_frame)
{
    int i;

    if (n_frame <= 0)
        return;
    for (i = 0; i < n_frame; ++i) {
        if (mfc[i][0] > agc->obs_max) {
            agc->obs_max = mfc[i][0];
            agc->obs_frame = 1;
        }
        mfc[i][0] -= agc->max;
    }
}